

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::generateIntegerWidthOption
               (int32_t minInt,int32_t maxInt,UnicodeString *sb,UErrorCode *param_4)

{
  if (maxInt == -1) {
    UnicodeString::append(sb,L'+');
  }
  else {
    anon_unknown.dwarf_19a874::appendMultiple(sb,0x23,maxInt - minInt);
  }
  anon_unknown.dwarf_19a874::appendMultiple(sb,0x30,minInt);
  return;
}

Assistant:

void blueprint_helpers::generateIntegerWidthOption(int32_t minInt, int32_t maxInt, UnicodeString& sb,
                                                   UErrorCode&) {
    if (maxInt == -1) {
        sb.append(u'+');
    } else {
        appendMultiple(sb, u'#', maxInt - minInt);
    }
    appendMultiple(sb, u'0', minInt);
}